

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# features.c
# Opt level: O3

char * faup_features_get_string(faup_handler_t *fh,faup_features_field_t field)

{
  void *__dest;
  char *pcVar1;
  ulong uVar2;
  uint32_t uVar3;
  
  switch(field) {
  case FAUP_FEATURES_FIELD_SCHEME:
    uVar2._0_4_ = (fh->faup).features.scheme.field;
    uVar2._4_4_ = (fh->faup).features.scheme.pos;
    uVar3 = (fh->faup).features.scheme.size;
    break;
  case FAUP_FEATURES_FIELD_HIERARCHICAL:
    uVar2._0_4_ = (fh->faup).features.hierarchical.field;
    uVar2._4_4_ = (fh->faup).features.hierarchical.pos;
    uVar3 = (fh->faup).features.hierarchical.size;
    break;
  case FAUP_FEATURES_FIELD_CREDENTIAL:
    uVar2._0_4_ = (fh->faup).features.credential.field;
    uVar2._4_4_ = (fh->faup).features.credential.pos;
    uVar3 = (fh->faup).features.credential.size;
    break;
  case FAUP_FEATURES_FIELD_SUBDOMAIN:
    uVar2._0_4_ = (fh->faup).features.subdomain.field;
    uVar2._4_4_ = (fh->faup).features.subdomain.pos;
    uVar3 = (fh->faup).features.subdomain.size;
    break;
  case FAUP_FEATURES_FIELD_DOMAIN:
    uVar2._0_4_ = (fh->faup).features.domain.field;
    uVar2._4_4_ = (fh->faup).features.domain.pos;
    uVar3 = (fh->faup).features.domain.size;
    break;
  case FAUP_FEATURES_FIELD_DOMAIN_WITHOUT_TLD:
    uVar2._0_4_ = (fh->faup).features.domain_without_tld.field;
    uVar2._4_4_ = (fh->faup).features.domain_without_tld.pos;
    uVar3 = (fh->faup).features.domain_without_tld.size;
    break;
  case FAUP_FEATURES_FIELD_HOST:
    uVar2._0_4_ = (fh->faup).features.host.field;
    uVar2._4_4_ = (fh->faup).features.host.pos;
    uVar3 = (fh->faup).features.host.size;
    break;
  case FAUP_FEATURES_FIELD_TLD:
    uVar2._0_4_ = (fh->faup).features.tld.field;
    uVar2._4_4_ = (fh->faup).features.tld.pos;
    uVar3 = (fh->faup).features.tld.size;
    break;
  case FAUP_FEATURES_FIELD_PORT:
    uVar2._0_4_ = (fh->faup).features.port.field;
    uVar2._4_4_ = (fh->faup).features.port.pos;
    uVar3 = (fh->faup).features.port.size;
    break;
  case FAUP_FEATURES_FIELD_RESOURCE_PATH:
    uVar2._0_4_ = (fh->faup).features.resource_path.field;
    uVar2._4_4_ = (fh->faup).features.resource_path.pos;
    uVar3 = (fh->faup).features.resource_path.size;
    break;
  case FAUP_FEATURES_FIELD_QUERY_STRING:
    uVar2._0_4_ = (fh->faup).features.query_string.field;
    uVar2._4_4_ = (fh->faup).features.query_string.pos;
    uVar3 = (fh->faup).features.query_string.size;
    break;
  case FAUP_FEATURES_FIELD_FRAGMENT:
    uVar2._0_4_ = (fh->faup).features.fragment.field;
    uVar2._4_4_ = (fh->faup).features.fragment.pos;
    uVar3 = (fh->faup).features.fragment.size;
    break;
  default:
    goto switchD_001160e5_default;
  }
  if (uVar3 != 0 && -1 < (long)uVar2) {
    __dest = malloc((ulong)(uVar3 + 1));
    *(undefined1 *)((long)__dest + (ulong)uVar3) = 0;
    pcVar1 = (char *)memcpy(__dest,(fh->faup).org_str + (uVar2 >> 0x20),(ulong)uVar3);
    return pcVar1;
  }
switchD_001160e5_default:
  return (char *)0x0;
}

Assistant:

char *faup_features_get_string(faup_handler_t *fh, faup_features_field_t field)
{
  char *retstring = NULL;

  switch(field) {
  case FAUP_FEATURES_FIELD_SCHEME:
    return _get_feature_string(fh, fh->faup.features.scheme);
    break;
  case FAUP_FEATURES_FIELD_HIERARCHICAL:
    return _get_feature_string(fh, fh->faup.features.hierarchical);
    break;
  case FAUP_FEATURES_FIELD_CREDENTIAL:
    return _get_feature_string(fh, fh->faup.features.credential);
    break;
  case FAUP_FEATURES_FIELD_SUBDOMAIN:
    return _get_feature_string(fh, fh->faup.features.subdomain);
    break;
  case FAUP_FEATURES_FIELD_DOMAIN:
    return _get_feature_string(fh, fh->faup.features.domain);
    break;
  case FAUP_FEATURES_FIELD_DOMAIN_WITHOUT_TLD:
    return _get_feature_string(fh, fh->faup.features.domain_without_tld);
    break;
  case FAUP_FEATURES_FIELD_HOST:
    return _get_feature_string(fh, fh->faup.features.host);
    break;
  case FAUP_FEATURES_FIELD_TLD:
    return _get_feature_string(fh, fh->faup.features.tld);
    break;
  case FAUP_FEATURES_FIELD_PORT:
    return _get_feature_string(fh, fh->faup.features.port);
    break;
  case FAUP_FEATURES_FIELD_RESOURCE_PATH:
    return _get_feature_string(fh, fh->faup.features.resource_path);
    break;
  case FAUP_FEATURES_FIELD_QUERY_STRING:
    return _get_feature_string(fh, fh->faup.features.query_string);
    break;
  case FAUP_FEATURES_FIELD_FRAGMENT:
    return _get_feature_string(fh, fh->faup.features.fragment);
    break;
  }

  return NULL;
}